

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FixSelect(DbFixer *pFix,Select *pSelect)

{
  ExprList *pEVar1;
  int iVar2;
  With *pWVar3;
  int iVar4;
  ExprList_item *pEVar5;
  long lVar6;
  long lVar7;
  
  if (pSelect == (Select *)0x0) {
    iVar4 = 0;
  }
  else {
    while( true ) {
      pEVar1 = pSelect->pEList;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar5 = pEVar1->a;
        iVar4 = 0;
        do {
          iVar2 = sqlite3FixExpr(pFix,pEVar5->pExpr);
          if (iVar2 != 0) {
            return 1;
          }
          iVar4 = iVar4 + 1;
          pEVar5 = pEVar5 + 1;
        } while (iVar4 < pEVar1->nExpr);
      }
      iVar2 = sqlite3FixSrcList(pFix,pSelect->pSrc);
      iVar4 = 1;
      if ((iVar2 != 0) || (iVar2 = sqlite3FixExpr(pFix,pSelect->pWhere), iVar2 != 0)) break;
      pEVar1 = pSelect->pGroupBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar5 = pEVar1->a;
        iVar4 = 0;
        do {
          iVar2 = sqlite3FixExpr(pFix,pEVar5->pExpr);
          if (iVar2 != 0) {
            return 1;
          }
          iVar4 = iVar4 + 1;
          pEVar5 = pEVar5 + 1;
        } while (iVar4 < pEVar1->nExpr);
      }
      iVar4 = sqlite3FixExpr(pFix,pSelect->pHaving);
      if (iVar4 != 0) {
        return 1;
      }
      pEVar1 = pSelect->pOrderBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar5 = pEVar1->a;
        iVar4 = 0;
        do {
          iVar2 = sqlite3FixExpr(pFix,pEVar5->pExpr);
          if (iVar2 != 0) {
            return 1;
          }
          iVar4 = iVar4 + 1;
          pEVar5 = pEVar5 + 1;
        } while (iVar4 < pEVar1->nExpr);
      }
      iVar4 = sqlite3FixExpr(pFix,pSelect->pLimit);
      if (iVar4 != 0) {
        return 1;
      }
      pWVar3 = pSelect->pWith;
      if ((pWVar3 != (With *)0x0) && (0 < pWVar3->nCte)) {
        lVar7 = 0x20;
        lVar6 = 0;
        do {
          iVar4 = sqlite3FixSelect(pFix,*(Select **)((long)pWVar3->a + lVar7 + -0x10));
          if (iVar4 != 0) {
            return 1;
          }
          lVar6 = lVar6 + 1;
          pWVar3 = pSelect->pWith;
          lVar7 = lVar7 + 0x20;
        } while (lVar6 < pWVar3->nCte);
      }
      pSelect = pSelect->pPrior;
      if (pSelect == (Select *)0x0) {
        return 0;
      }
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSelect(
  DbFixer *pFix,       /* Context of the fixation */
  Select *pSelect      /* The SELECT statement to be fixed to one database */
){
  while( pSelect ){
    if( sqlite3FixExprList(pFix, pSelect->pEList) ){
      return 1;
    }
    if( sqlite3FixSrcList(pFix, pSelect->pSrc) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pWhere) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pSelect->pGroupBy) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pHaving) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pSelect->pOrderBy) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pLimit) ){
      return 1;
    }
    if( pSelect->pWith ){
      int i;
      for(i=0; i<pSelect->pWith->nCte; i++){
        if( sqlite3FixSelect(pFix, pSelect->pWith->a[i].pSelect) ){
          return 1;
        }
      }
    }
    pSelect = pSelect->pPrior;
  }
  return 0;
}